

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O2

uint64_t estimateDiv128To64(uint64_t a0,uint64_t a1,uint64_t b)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong b_00;
  ulong uVar4;
  bool bVar5;
  uint64_t term1;
  uint64_t term0;
  
  if (a0 < b) {
    uVar3 = b >> 0x20;
    b_00 = 0xffffffff00000000;
    if (a0 < (b & 0xffffffff00000000)) {
      b_00 = a0 / uVar3 << 0x20;
    }
    mul64To128(b,b_00,&term0,&term1);
    uVar4 = a1 - term1;
    for (lVar1 = (a0 - term0) - (ulong)(a1 < term1); lVar1 < 0; lVar1 = lVar1 + uVar3 + (ulong)bVar5
        ) {
      b_00 = b_00 - 0x100000000;
      bVar5 = CARRY8(uVar4,b << 0x20);
      uVar4 = uVar4 + (b << 0x20);
    }
    uVar2 = lVar1 << 0x20 | uVar4 >> 0x20;
    uVar4 = 0xffffffff;
    if (uVar2 < (b & 0xffffffff00000000)) {
      uVar4 = uVar2 / uVar3;
    }
    return uVar4 | b_00;
  }
  return 0xffffffffffffffff;
}

Assistant:

static inline uint64_t estimateDiv128To64(uint64_t a0, uint64_t a1, uint64_t b)
{
    uint64_t b0, b1;
    uint64_t rem0, rem1, term0, term1;
    uint64_t z;

    if ( b <= a0 ) return UINT64_C(0xFFFFFFFFFFFFFFFF);
    b0 = b>>32;
    z = ( b0<<32 <= a0 ) ? UINT64_C(0xFFFFFFFF00000000) : ( a0 / b0 )<<32;
    mul64To128( b, z, &term0, &term1 );
    sub128( a0, a1, term0, term1, &rem0, &rem1 );
    while ( ( (int64_t) rem0 ) < 0 ) {
        z -= UINT64_C(0x100000000);
        b1 = b<<32;
        add128( rem0, rem1, b0, b1, &rem0, &rem1 );
    }
    rem0 = ( rem0<<32 ) | ( rem1>>32 );
    z |= ( b0<<32 <= rem0 ) ? 0xFFFFFFFF : rem0 / b0;
    return z;

}